

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vacuum_statement.cpp
# Opt level: O2

void __thiscall
duckdb::VacuumStatement::VacuumStatement(VacuumStatement *this,VacuumOptions *options)

{
  SQLStatement::SQLStatement(&this->super_SQLStatement,VACUUM_STATEMENT);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__VacuumStatement_027936d0;
  make_uniq<duckdb::VacuumInfo,duckdb::VacuumOptions_const&>((duckdb *)&this->info,options);
  return;
}

Assistant:

VacuumStatement::VacuumStatement(const VacuumOptions &options)
    : SQLStatement(StatementType::VACUUM_STATEMENT), info(make_uniq<VacuumInfo>(options)) {
}